

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

BrailleCanvas * __thiscall
plot::BrailleCanvas::ellipse(BrailleCanvas *this,Color *color,Rect rct,TerminalOp op)

{
  Rect rct_00;
  Rect rct_01;
  Rect rct_02;
  Rect rct_03;
  BrailleCanvas *pBVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  GenericPoint<long> GVar9;
  anon_class_32_4_b873ab05 local_b0;
  anon_class_32_4_b873ab04 local_90;
  anon_class_32_4_b873ab05 local_70;
  anon_class_32_4_b873ab04 local_50;
  
  lVar2 = rct.p2.x;
  if (rct.p1.x < rct.p2.x) {
    lVar2 = rct.p1.x;
  }
  if (rct.p2.x < rct.p1.x) {
    rct.p2.x = rct.p1.x;
  }
  lVar7 = rct.p2.y;
  if (rct.p1.y < rct.p2.y) {
    lVar7 = rct.p1.y;
  }
  if (rct.p2.y < rct.p1.y) {
    rct.p2.y = rct.p1.y;
  }
  rct.p1.x = lVar2;
  rct.p1.y = lVar7;
  GVar9 = GenericRect<long>::size(&rct);
  lVar7 = rct.p1.y;
  uVar5 = GVar9.x + 1;
  lVar2 = GVar9.y + 1;
  fVar8 = 2.0 / (float)(long)uVar5;
  lVar4 = lVar2 / 2 - (ulong)(~(uint)lVar2 & 1);
  lVar3 = (long)uVar5 / 2 + rct.p1.x;
  lVar6 = lVar3 + (uVar5 | 0xfffffffffffffffe) + 1;
  lVar2 = lVar4 + rct.p1.y;
  pBVar1 = push(this);
  local_50.x0 = rct.p1.x;
  rct_00.p1.y = rct.p1.y;
  rct_00.p1.x = rct.p1.x;
  rct_00.p2.x = lVar6;
  rct_00.p2.y = lVar2;
  local_50.x_fac = fVar8;
  local_50.y_fac = lVar4;
  local_50.cy = lVar2;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (pBVar1,color,rct_00,&local_50,Over);
  lVar3 = lVar3 + (uVar5 | 0xfffffffffffffffe) + 2;
  local_70.x1 = rct.p2.x;
  rct_01.p1.y = rct.p1.y;
  rct_01.p1.x = lVar3;
  rct_01.p2.x = rct.p2.x;
  rct_01.p2.y = lVar2;
  local_70.x_fac = fVar8;
  local_70.y_fac = lVar4;
  local_70.cy = lVar2;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_2_>
                     (pBVar1,color,rct_01,&local_70,Over);
  lVar7 = lVar4 + lVar7 + 1;
  local_90.x0 = rct.p1.x;
  rct_02.p1.y = lVar7;
  rct_02.p1.x = rct.p1.x;
  rct_02.p2.x = lVar6;
  rct_02.p2.y = rct.p2.y;
  local_90.x_fac = fVar8;
  local_90.y_fac = lVar4;
  local_90.cy = lVar2;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_3_>
                     (pBVar1,color,rct_02,&local_90,Over);
  local_b0.x1 = rct.p2.x;
  rct_03.p1.y = lVar7;
  rct_03.p1.x = lVar3;
  rct_03.p2.x = rct.p2.x;
  rct_03.p2.y = rct.p2.y;
  local_b0.x_fac = fVar8;
  local_b0.y_fac = lVar4;
  local_b0.cy = lVar2;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_4_>
                     (pBVar1,color,rct_03,&local_b0,Over);
  pBVar1 = pop(pBVar1,op);
  return pBVar1;
}

Assistant:

BrailleCanvas& ellipse(Color const& color, Rect rct, TerminalOp op = TerminalOp::Over) {
        rct = rct.sorted();
        auto size_ = rct.size() + Point(1, 1);

        float x_fac = 2.0f/size_.x;
        Coord y_fac = size_.y/2 - (!(size_.y % 2)),
              cx = rct.p1.x + (size_.x/cell_cols) - (!(size_.x % cell_cols)),
              cy = rct.p1.y + y_fac;

        return push()
              .stroke(color, { rct.p1, { cx, cy } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { cx + 1, rct.p1.y }, { rct.p2.x, cy } }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((x1 - x + 1) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { rct.p1.x, cy + 1 }, { cx, rct.p2.y } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(color, { { cx + 1, cy + 1 }, rct.p2 }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x1 - x) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .pop(op);
    }